

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_graph.c
# Opt level: O2

ecs_table_t *
ecs_table_traverse_remove
          (ecs_world_t *world,ecs_table_t *node,ecs_entities_t *to_remove,ecs_entities_t *removed)

{
  int iVar1;
  ecs_entity_t *peVar2;
  ecs_entity_t e;
  ecs_edge_t *peVar3;
  ecs_table_t *peVar4;
  ulong uVar5;
  ulong uVar6;
  ecs_table_t *node_00;
  
  node_00 = &(world->store).root;
  if (node != (ecs_table_t *)0x0) {
    node_00 = node;
  }
  uVar5 = 0;
  uVar6 = (ulong)(uint)to_remove->count;
  if (to_remove->count < 1) {
    uVar6 = uVar5;
  }
  peVar2 = to_remove->array;
  do {
    if (uVar6 == uVar5) {
      return node_00;
    }
    e = peVar2[uVar5];
    _ecs_assert(e != 0,2,(char *)0x0,"e != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/table_graph.c"
                ,0x220);
    if (e == 0) {
      __assert_fail("e != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/table_graph.c"
                    ,0x220,
                    "ecs_table_t *ecs_table_traverse_remove(ecs_world_t *, ecs_table_t *, ecs_entities_t *, ecs_entities_t *)"
                   );
    }
    peVar3 = get_edge(node_00,e);
    peVar4 = peVar3->remove;
    if (peVar4 == (ecs_table_t *)0x0) {
      peVar4 = node_00;
      if (peVar3->add == node_00) {
        peVar4 = find_or_create_table_exclude(world,node_00,e);
        if (peVar4 == (ecs_table_t *)0x0) {
          return (ecs_table_t *)0x0;
        }
        peVar3->remove = peVar4;
        goto LAB_001253b8;
      }
    }
    else {
LAB_001253b8:
      if ((removed != (ecs_entities_t *)0x0) && (((char)(e >> 0x38) == -4 || (node_00 != peVar4))))
      {
        iVar1 = removed->count;
        removed->count = iVar1 + 1;
        removed->array[iVar1] = e;
      }
    }
    uVar5 = uVar5 + 1;
    node_00 = peVar4;
  } while( true );
}

Assistant:

ecs_table_t* ecs_table_traverse_remove(
    ecs_world_t * world,
    ecs_table_t * node,
    ecs_entities_t * to_remove,
    ecs_entities_t * removed)
{
    int32_t i, count = to_remove->count;
    ecs_entity_t *entities = to_remove->array;
    node = node ? node : &world->store.root;

    for (i = 0; i < count; i ++) {
        ecs_entity_t e = entities[i];

        /* Removing 0 from an entity is not valid */
        ecs_assert(e != 0, ECS_INVALID_PARAMETER, NULL);

        ecs_edge_t *edge = get_edge(node, e);
        ecs_table_t *next = edge->remove;

        if (!next) {
            if (edge->add == node) {
                /* Find table with all components of node except 'e' */
                next = find_or_create_table_exclude(world, node, e);
                if (!next) {
                    return NULL;
                }

                edge->remove = next;
            } else {
                /* If the add edge does not point to self, the table
                 * does not have the entity in to_remove. */
                continue;
            }
        }

        bool has_case = ECS_HAS_ROLE(e, CASE);
        if (removed && (node != next || has_case)) {
            removed->array[removed->count ++] = e; 
        }

        node = next;
    }    

    return node;
}